

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O2

convertable * __thiscall
mpt::node_relation::find(node_relation *this,type_t type,char *name,int nlen)

{
  node *pnVar1;
  convertable *pcVar2;
  relation *prVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  undefined4 extraout_var;
  node **ppnVar7;
  
  pnVar1 = this->_curr;
  if (pnVar1 != (node *)0x0) {
    sVar6 = (size_t)(uint)nlen;
    if (nlen < 0) {
      if (name == (char *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = strlen(name);
      }
    }
    ppnVar7 = &pnVar1->children;
    while( true ) {
      pnVar1 = *ppnVar7;
      if (pnVar1 == (node *)0x0) break;
      pcVar2 = &pnVar1->_meta->super_convertable;
      if ((pcVar2 != (convertable *)0x0) &&
         ((name == (char *)0x0 || (bVar4 = identifier::equal(&pnVar1->ident,name,(int)sVar6), bVar4)
          ))) {
        if (type == 0) {
          return pcVar2;
        }
        iVar5 = (**pcVar2->_vptr_convertable)(pcVar2,type,0);
        if (-1 < iVar5) {
          return pcVar2;
        }
      }
      ppnVar7 = &pnVar1->next;
    }
    prVar3 = this->_parent;
    if (prVar3 != (relation *)0x0) {
      iVar5 = (**prVar3->_vptr_relation)(prVar3,type,name,sVar6 & 0xffffffff);
      return (convertable *)CONCAT44(extraout_var,iVar5);
    }
  }
  return (convertable *)0x0;
}

Assistant:

convertable *node_relation::find(type_t type, const char *name, int nlen) const
{
	if (!_curr) {
		return 0;
	}
	if (nlen < 0) nlen = name ? strlen(name) : 0;

	for (const node *c = _curr->children; c; c = c->next) {
		metatype *m;
		if (!(m = c->_meta)) {
			continue;
		}
		if (name && !c->ident.equal(name, nlen)) {
			continue;
		}
		// optional type restriction
		if (type && m->convert(type, 0) < 0) {
			continue;
		}
		return m;
	}
	return _parent ? _parent->find(type, name, nlen) : 0;
}